

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

Udata * luaS_newudata(lua_State *L,size_t s,Table *e)

{
  GCObject *pGVar1;
  
  if (0xffffffffffffffd5 < s) {
    luaM_toobig(L);
  }
  pGVar1 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,s + 0x28);
  (pGVar1->gch).marked = L->l_G->currentwhite & 3;
  (pGVar1->gch).tt = '\a';
  (pGVar1->h).node = (Node *)s;
  (pGVar1->h).metatable = (Table *)0x0;
  (pGVar1->h).array = (TValue *)e;
  (pGVar1->gch).next = L->l_G->mainthread->next;
  L->l_G->mainthread->next = pGVar1;
  return (Udata *)pGVar1;
}

Assistant:

Udata *luaS_newudata (lua_State *L, size_t s, Table *e) {
  Udata *u;
  if (s > MAX_SIZET - sizeof(Udata))
    luaM_toobig(L);
  u = cast(Udata *, luaM_malloc(L, s + sizeof(Udata)));
  u->uv.marked = luaC_white(G(L));  /* is not finalized */
  u->uv.tt = LUA_TUSERDATA;
  u->uv.len = s;
  u->uv.metatable = NULL;
  u->uv.env = e;
  /* chain it on udata list (after main thread) */
  u->uv.next = G(L)->mainthread->next;
  G(L)->mainthread->next = obj2gco(u);
  return u;
}